

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error-reporter.h
# Opt level: O2

void __thiscall
capnp::compiler::ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader>
          (ErrorReporter *this,Reader *decl,StringPtr message)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = (decl->_reader).dataSize;
  uVar3 = 0;
  if (uVar1 < 0x40) {
    uVar4 = 0;
  }
  else {
    pvVar2 = (decl->_reader).data;
    uVar4 = (ulong)*(uint *)((long)pvVar2 + 4);
    if (0x9f < uVar1) {
      uVar3 = (ulong)*(uint *)((long)pvVar2 + 0x10);
    }
  }
  (**this->_vptr_ErrorReporter)(this,uVar4,uVar3,message.content.ptr,message.content.size_);
  return;
}

Assistant:

inline void addErrorOn(T&& decl, kj::StringPtr message) {
    // Works for any `T` that defines `getStartByte()` and `getEndByte()` methods, which many
    // of the Cap'n Proto types defined in `grammar.capnp` do.

    addError(decl.getStartByte(), decl.getEndByte(), message);
  }